

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

OBSOLETE_length_format ON_DimStyle::OBSOLETE_LengthFormatFromUnsigned(uint format_as_unsigned)

{
  if (3 < format_as_unsigned) {
    format_as_unsigned = 0;
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_dimensionstyle.cpp"
               ,0x1e9,"","invalid format_as_unsigned parameter.");
  }
  return (OBSOLETE_length_format)format_as_unsigned;
}

Assistant:

ON_DimStyle::OBSOLETE_length_format ON_DimStyle::OBSOLETE_LengthFormatFromUnsigned(
  unsigned int format_as_unsigned
  )
{
  switch (format_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::OBSOLETE_length_format::Decimal);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::OBSOLETE_length_format::Fractional);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::OBSOLETE_length_format::FeetInches);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_DimStyle::OBSOLETE_length_format::FeetDecimalInches);
  }
  ON_ERROR("invalid format_as_unsigned parameter.");
  return (ON_DimStyle::OBSOLETE_length_format::Decimal);
}